

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

void wasm::Debug::writeDWARFSections(Module *wasm,BinaryLocations *newLocations)

{
  pointer str;
  pointer *this;
  LineNumberOps LVar1;
  Tag TVar2;
  short sVar3;
  LineNumberExtendedOps LVar4;
  LineTableOpcode *pLVar5;
  pointer pLVar6;
  _Hash_node_base *p_Var7;
  pointer puVar8;
  pointer pEVar9;
  tuple<llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_> tVar10;
  void *pvVar11;
  pointer pFVar12;
  pointer pCVar13;
  MemoryBuffer *pMVar14;
  char *pcVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  pointer pLVar18;
  pointer pLVar19;
  StringRef Key;
  StringRef Key_00;
  undefined1 auVar20 [16];
  pointer pLVar21;
  undefined8 uVar22;
  undefined4 oldAddr;
  bool bVar23;
  BinaryLocation BVar24;
  uint uVar25;
  size_type sVar26;
  mapped_type *pmVar27;
  mapped_type *pmVar28;
  __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
  _Var29;
  mapped_type *pmVar30;
  mapped_type *pmVar31;
  size_type sVar32;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *puVar33;
  BinaryLocation BVar34;
  pointer pAVar35;
  char *pcVar36;
  uint uVar37;
  LineTableOpcode *opcode;
  long lVar38;
  pointer pUVar39;
  ulong uVar40;
  ulong uVar41;
  vector<char,_std::allocator<char>_> *this_00;
  BinaryLocation BVar42;
  ulong uVar43;
  OldToNew in_R9;
  byte bVar44;
  int iVar45;
  ptrdiff_t _Num;
  pointer pFVar46;
  long lVar47;
  size_type __new_size;
  uint *puVar48;
  uint uVar49;
  size_t i;
  LineTable *table;
  ulong uVar50;
  bool bVar51;
  error_code eVar52;
  unit_iterator_range uVar53;
  die_iterator_range dVar54;
  undefined1 local_658 [8];
  Data data;
  LocationUpdater locationUpdater;
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  newSections;
  __node_base a_Stack_2c8 [44];
  undefined1 local_168 [8];
  BinaryenDWARFInfo info;
  __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
  local_130;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *local_120;
  vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
  local_118;
  mapped_type local_100;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *local_f8;
  Module *local_f0;
  undefined1 auStack_e8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> newAddrs;
  LineState local_c8;
  undefined1 auStack_a8 [8];
  BinaryLocation newAddr;
  undefined8 local_98;
  undefined8 uStack_90;
  uint32_t uStack_8c;
  uint local_7c;
  undefined1 auStack_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> llvmName;
  BinaryLocation local_44;
  pointer local_40;
  
  local_f0 = wasm;
  BinaryenDWARFInfo::BinaryenDWARFInfo((BinaryenDWARFInfo *)local_168,wasm);
  data.PubNames.UnitOffset._0_1_ = 0;
  data.PubNames.UnitSize = 0;
  data.PubNames.IsGNUStyle = false;
  data.PubNames._29_3_ = 0;
  data.PubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.PubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.PubTypes.UnitOffset._0_1_ = 0;
  data.PubTypes.UnitSize = 0;
  data.PubTypes.IsGNUStyle = false;
  data.PubTypes._29_3_ = 0;
  data.PubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.PubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubNames.UnitOffset._0_1_ = 0;
  data.GNUPubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubNames.UnitSize = 0;
  data.GNUPubNames.IsGNUStyle = false;
  data.GNUPubNames._29_3_ = 0;
  data.GNUPubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.GNUPubTypes.UnitOffset._0_1_ = 0;
  data.IsLittleEndian = false;
  data._1_7_ = 0;
  data.AbbrevDecls.
  super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.AbbrevDecls.
  super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.AbbrevDecls.
  super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.DebugStrings.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.DebugStrings.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.DebugStrings.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.ARanges.super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.ARanges.super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.ARanges.super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.Ranges.super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.Ranges.super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.Ranges.super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.Locs.super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.Locs.super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.CompileUnits.
  super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.DebugLines.
  super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.CompileUnits.
  super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.CompileUnits.
  super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.GNUPubTypes.UnitSize = 0;
  data.GNUPubTypes.IsGNUStyle = false;
  data.GNUPubTypes._29_3_ = 0;
  data.GNUPubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.DebugLines.
  super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  eVar52 = dwarf2yaml((DWARFContext *)info.sections._24_8_,(Data *)local_658);
  if (eVar52._M_value != 0) {
    Fatal::Fatal((Fatal *)&data.DebugLines.
                           super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Fatal::operator<<((Fatal *)&data.DebugLines.
                                super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (char (*) [30])"Failed to parse DWARF to YAML");
    Fatal::~Fatal((Fatal *)&data.DebugLines.
                            super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  LocationUpdater::LocationUpdater
            ((LocationUpdater *)
             &data.DebugLines.
              super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_f0,newLocations);
  pLVar21 = data.DebugLines.
            super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (table = (LineTable *)
               data.CompileUnits.
               super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage; table != pLVar21;
      table = table + 1) {
    auStack_78._0_4_ = 0;
    auStack_78._4_4_ = 1;
    llvmName._M_dataplus._M_p._0_4_ = 0;
    llvmName._M_dataplus._M_p._4_4_ = 1;
    llvmName._M_string_length = 0;
    llvmName.field_2._M_local_buf[0] = table->DefaultIsStmt != '\0';
    llvmName.field_2._M_local_buf[1] = '\0';
    llvmName.field_2._M_local_buf[2] = '\0';
    llvmName.field_2._M_local_buf[3] = '\0';
    llvmName.field_2._M_allocated_capacity._4_4_ = 0;
    auStack_e8 = (undefined1  [8])0x0;
    newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    locationUpdater.compileUnitBases._M_h._M_single_bucket = a_Stack_2c8;
    newSections.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x1;
    newSections.super_StringMapImpl.NumBuckets = 0;
    newSections.super_StringMapImpl.NumItems = 0;
    newSections.super_StringMapImpl.NumTombstones = 0;
    newSections.super_StringMapImpl.ItemSize = 0;
    newSections._24_4_ = 0x3f800000;
    a_Stack_2c8[0]._M_nxt = (_Hash_node_base *)0x0;
    pLVar5 = (table->Opcodes).
             super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar44 = 0;
    iVar45 = 0;
    for (opcode = (table->Opcodes).
                  super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
                  ._M_impl.super__Vector_impl_data._M_start; opcode != pLVar5; opcode = opcode + 1)
    {
      LVar1 = opcode->Opcode;
      LVar4 = opcode->SubOpcode;
      bVar23 = LineState::update((LineState *)auStack_78,opcode,table);
      oldAddr = auStack_78._0_4_;
      bVar44 = (LVar1 != DW_LNS_extended_op || LVar4 != DW_LNE_set_address) & bVar44;
      if (bVar23) {
        if ((bool)(auStack_78._0_4_ + 2 < 3 | bVar44)) {
          llvmName.field_2._M_local_buf[0] = table->DefaultIsStmt != '\0';
          auStack_78._0_4_ = 0;
          auStack_78._4_4_ = 1;
          llvmName._M_dataplus._M_p._0_4_ = 0;
          llvmName._M_dataplus._M_p._4_4_ = 1;
          llvmName._M_string_length = 0;
          llvmName.field_2._M_local_buf[1] = '\0';
          llvmName.field_2._M_local_buf[2] = '\0';
          llvmName.field_2._M_local_buf[3] = '\0';
          bVar44 = 1;
          llvmName.field_2._M_allocated_capacity._4_4_ = iVar45;
        }
        else {
          auVar20._12_4_ = 0;
          auVar20._0_12_ = stack0xffffffffffffff5c;
          _auStack_a8 = (StringRef)(auVar20 << 0x20);
          bVar23 = LocationUpdater::hasOldExprStart
                             ((LocationUpdater *)
                              &data.DebugLines.
                               super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,auStack_78._0_4_);
          if (bVar23) {
            BVar24 = LocationUpdater::getNewExprStart
                               ((LocationUpdater *)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,oldAddr);
LAB_00cd310f:
            auStack_a8._0_4_ = BVar24;
          }
          else {
            bVar23 = LocationUpdater::hasOldFuncEnd
                               ((LocationUpdater *)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,oldAddr);
            if (bVar23) {
              BVar24 = LocationUpdater::getNewFuncEnd
                                 ((LocationUpdater *)
                                  &data.DebugLines.
                                   super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,oldAddr);
              goto LAB_00cd310f;
            }
            bVar23 = LocationUpdater::hasOldFuncStart
                               ((LocationUpdater *)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,oldAddr);
            if (bVar23) {
              BVar24 = LocationUpdater::getNewFuncStart
                                 ((LocationUpdater *)
                                  &data.DebugLines.
                                   super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,oldAddr);
              goto LAB_00cd310f;
            }
            bVar23 = LocationUpdater::hasOldDelimiter
                               ((LocationUpdater *)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,oldAddr);
            if (bVar23) {
              BVar24 = LocationUpdater::getNewDelimiter
                                 ((LocationUpdater *)
                                  &data.DebugLines.
                                   super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,oldAddr);
              goto LAB_00cd310f;
            }
            bVar23 = LocationUpdater::hasOldExprEnd
                               ((LocationUpdater *)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,oldAddr);
            if (bVar23) {
              BVar24 = LocationUpdater::getNewExprEnd
                                 ((LocationUpdater *)
                                  &data.DebugLines.
                                   super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,oldAddr);
              goto LAB_00cd310f;
            }
            BVar24 = auStack_a8._0_4_;
          }
          if (((BVar24 == 0) || (auStack_78._4_4_ == 0)) || (auStack_78._0_4_ == 0)) {
LAB_00cd318a:
            if ((opcode->Opcode == DW_LNS_extended_op) && (opcode->SubOpcode == DW_LNE_end_sequence)
               ) {
              iVar45 = iVar45 + 1;
              if (iVar45 == -1) {
                __assert_fail("sequenceId != uint32_t(-1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                              ,0x2d9,
                              "void wasm::Debug::updateDebugLines(llvm::DWARFYAML::Data &, LocationUpdater &)"
                             );
              }
              llvmName.field_2._M_local_buf[0] = table->DefaultIsStmt != '\0';
              auStack_78._0_4_ = 0;
              auStack_78._4_4_ = 1;
              llvmName._M_dataplus._M_p._0_4_ = 0;
              llvmName._M_dataplus._M_p._4_4_ = 1;
              llvmName._M_string_length = 0;
              llvmName.field_2._M_local_buf[1] = '\0';
              llvmName.field_2._M_local_buf[2] = '\0';
              llvmName.field_2._M_local_buf[3] = '\0';
              llvmName.field_2._M_allocated_capacity._4_4_ = iVar45;
            }
          }
          else {
            sVar26 = std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                             (key_type *)auStack_a8);
            if (sVar26 == 0) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_e8,
                         (value_type_conflict2 *)auStack_a8);
              std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Debug::LineState>,std::allocator<std::pair<unsigned_int_const,wasm::Debug::LineState>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<unsigned_int&,wasm::Debug::LineState&>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Debug::LineState>,std::allocator<std::pair<unsigned_int_const,wasm::Debug::LineState>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,auStack_a8,
                         auStack_78);
              pmVar27 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                             (key_type *)auStack_a8);
              pmVar27->addr = auStack_a8._0_4_;
              llvmName.field_2._M_local_buf[2] = '\0';
              goto LAB_00cd318a;
            }
          }
          bVar44 = 0;
        }
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auStack_e8,
               newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar38 = 4;
    uVar50 = 0;
    while (uVar50 < (ulong)((long)newAddrs.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start - (long)auStack_e8 >> 2))
    {
      pmVar27 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                     (key_type *)((long)auStack_e8 + lVar38 + -4));
      uVar16 = pmVar27->addr;
      uVar17 = pmVar27->line;
      _auStack_a8 = *(StringRef *)pmVar27;
      local_98._0_4_ = pmVar27->isa;
      local_98._4_4_ = pmVar27->discriminator;
      uStack_90._0_1_ = pmVar27->isStmt;
      uStack_90._1_1_ = pmVar27->basicBlock;
      uStack_90._2_1_ = pmVar27->prologueEnd;
      uStack_90._3_1_ = pmVar27->epilogueBegin;
      uStack_8c = pmVar27->sequenceId;
      if ((uVar17 == 0) || (uVar16 == 0)) {
        __assert_fail("state.needToEmit()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                      ,0x2e6,
                      "void wasm::Debug::updateDebugLines(llvm::DWARFYAML::Data &, LocationUpdater &)"
                     );
      }
      local_c8.addr = 0;
      local_c8.line = 1;
      local_c8.col = 0;
      local_c8.file = 1;
      local_c8.isa = 0;
      local_c8.discriminator = 0;
      local_c8._25_3_ = 0;
      local_c8.isStmt = table->DefaultIsStmt != '\0';
      local_c8.sequenceId = 0xffffffff;
      if (uVar50 != 0) {
        pmVar27 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                       (key_type *)((long)auStack_e8 + lVar38 + -8));
        local_c8.addr = pmVar27->addr;
        local_c8.line = pmVar27->line;
        local_c8.col = pmVar27->col;
        local_c8.file = pmVar27->file;
        local_c8.isa = pmVar27->isa;
        local_c8.discriminator = pmVar27->discriminator;
        local_c8.isStmt = pmVar27->isStmt;
        local_c8.basicBlock = pmVar27->basicBlock;
        local_c8.prologueEnd = pmVar27->prologueEnd;
        local_c8.epilogueBegin = pmVar27->epilogueBegin;
        local_c8.sequenceId = pmVar27->sequenceId;
        if (local_c8.sequenceId != uStack_8c) {
          local_c8.addr = 0;
          local_c8.line = 1;
          local_c8.col = 0;
          local_c8.file = 1;
          local_c8.isa = 0;
          local_c8.discriminator = 0;
          local_c8._25_3_ = 0;
          local_c8.isStmt = table->DefaultIsStmt != '\0';
          local_c8.sequenceId = 0xffffffff;
        }
      }
      uVar50 = uVar50 + 1;
      bVar23 = true;
      if (uVar50 != (long)newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start - (long)auStack_e8 >> 2) {
        pmVar27 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                       (key_type *)((long)auStack_e8 + lVar38));
        bVar23 = pmVar27->sequenceId != uStack_8c;
      }
      LineState::emitDiff((LineState *)auStack_a8,&local_c8,&local_118,table,bVar23);
      lVar38 = lVar38 + 4;
    }
    pLVar6 = (table->Opcodes).
             super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (table->Opcodes).
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_118.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pLVar18 = (table->Opcodes).
              super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar19 = (table->Opcodes).
              super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (table->Opcodes).
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_118.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (table->Opcodes).
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_118.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_start = pLVar18;
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar19;
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar6;
    std::vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ::~vector(&local_118);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_e8);
  }
  locationUpdater.compileUnitBases._M_h._M_single_bucket = (__node_base_ptr)0x0;
  newSections.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  newSections.super_StringMapImpl.NumBuckets = 0;
  newSections.super_StringMapImpl.NumItems = 0;
  llvm::DWARFYAML::ComputeDebugLine
            ((Data *)local_658,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &locationUpdater.compileUnitBases._M_h._M_single_bucket);
  lVar38 = 0;
  uVar37 = 0;
  for (uVar50 = 0;
      pUVar39 = data.CompileUnits.
                super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
      uVar50 < (ulong)(((long)data.DebugLines.
                              super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                              ._M_impl.super__Vector_impl_data._M_start -
                       (long)data.CompileUnits.
                             super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage) / 0x90);
      uVar50 = uVar50 + 1) {
    auStack_78._0_4_ =
         *(BinaryLocation *)
          ((long)&((data.CompileUnits.
                    super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->Length).TotalLength +
          lVar38);
    pmVar28 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&locationUpdater.locToUnitMap._M_h._M_single_bucket,
                           (key_type *)auStack_78);
    *pmVar28 = uVar37;
    *(ulong *)((long)&(pUVar39->Length).TotalLength + lVar38) = (ulong)uVar37;
    p_Var7 = locationUpdater.compileUnitBases._M_h._M_single_bucket[uVar50]._M_nxt;
    iVar45 = (int)p_Var7;
    if ((_Hash_node_base *)0xfffffffe < p_Var7) {
      *(_Hash_node_base **)((long)&pUVar39->Version + lVar38) = p_Var7;
      iVar45 = -1;
    }
    uVar37 = uVar37 + (int)p_Var7 + 4;
    *(int *)((long)&(pUVar39->Length).TotalLength64 + lVar38) = iVar45;
    lVar38 = lVar38 + 0x90;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             &locationUpdater.compileUnitBases._M_h._M_single_bucket);
  puVar8 = (local_f0->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((local_f0->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == puVar8) {
    local_7c = 4;
  }
  else {
    local_7c = (uint)((((puVar8->_M_t).
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->addressType).id
                     == 3) * 4 + 4;
  }
  uVar53 = llvm::DWARFContext::info_section_units((DWARFContext *)info.sections._24_8_);
  local_100 = 0;
  pUVar39 = (pointer)data.GNUPubTypes.Entries.
                     super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  while( true ) {
    local_120 = uVar53.end_iterator;
    local_f8 = uVar53.begin_iterator;
    if (local_f8 == local_120) break;
    if (pUVar39 ==
        data.CompileUnits.
        super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar36 = 
      "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit> *>, U = std::vector<llvm::DWARFYAML::Unit>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:889:5)]"
      ;
LAB_00cd3bcb:
      __assert_fail("yamlValue != yamlList.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                    ,0x310,pcVar36);
    }
    if (local_7c != pUVar39->AddrSize) {
      pUVar39->AddrSize = (uint8_t)local_7c;
      pUVar39->AddrSizeChanged = true;
    }
    dVar54 = llvm::DWARFUnit::dies
                       ((local_f8->_M_t).
                        super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                        .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl);
    local_40 = (pUVar39->Entries).
               super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
LAB_00cd3550:
    local_130 = dVar54.end_iterator._M_current;
    _Var29 = dVar54.begin_iterator._M_current;
    pEVar9 = (pUVar39->Entries).
             super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (_Var29._M_current != local_130._M_current) {
      if (local_40 != pEVar9) {
        tVar10.
        super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
        super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>)
             (_Var29._M_current)->AbbrevDecl;
        if (tVar10.
            super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
            super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl !=
            (_Head_base<0UL,_llvm::DWARFContext_*,_false>)0x0) {
          local_c8.addr = (undefined4)local_100;
          local_c8.line = local_100._4_4_;
          TVar2 = *(Tag *)((long)tVar10.
                                 super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                 .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl +
                          4);
          pvVar11 = (((AttributeSpecVector *)
                     ((long)tVar10.
                            super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                            .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl + 8))->
                    super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>).
                    super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                    .
                    super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                    .super_SmallVectorBase.BeginX;
          uVar37 = *(uint *)((long)tVar10.
                                   super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                   .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl
                            + 0x10);
          pFVar46 = (local_40->Values).
                    super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar38 = 0;
          BVar24 = 0;
          local_44 = 0;
          info.context._M_t.
          super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
          super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
               (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>
                )(__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>
                  )tVar10.
                   super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                   .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl;
LAB_00cd35c1:
          uVar22 = local_c8._0_8_;
          pFVar12 = (local_40->Values).
                    super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          uVar25 = (uint)TVar2;
          if ((ulong)uVar37 << 4 == lVar38) goto LAB_00cd36db;
          if (pFVar46 == pFVar12) {
            pcVar36 = 
            "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:807:5)]"
            ;
            goto LAB_00cd3bcb;
          }
          sVar3 = *(short *)((long)pvVar11 + lVar38);
          if (sVar3 == 2) {
            if (*(short *)((long)pvVar11 + lVar38 + 2) == 0x17) {
              locationUpdater.compileUnitBases._M_h._M_single_bucket =
                   (__node_base_ptr)
                   CONCAT44(locationUpdater.compileUnitBases._M_h._M_single_bucket._4_4_,
                            (int)(pFVar46->Value).value);
              pmVar30 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&locationUpdater.oldFuncAddrMap.endMap._M_h._M_single_bucket
                                     ,(key_type *)
                                      &locationUpdater.compileUnitBases._M_h._M_single_bucket);
              *pmVar30 = uVar22;
            }
            goto LAB_00cd3685;
          }
          if (sVar3 == 0x10) {
            uVar25 = LocationUpdater::getNewDebugLineLocation
                               ((LocationUpdater *)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (BinaryLocation)(pFVar46->Value).value);
            goto LAB_00cd364b;
          }
          if (sVar3 != 0x11) goto LAB_00cd3685;
          BVar24 = (BinaryLocation)(pFVar46->Value).value;
          if (uVar25 - 10 < 2) {
LAB_00cd3622:
            uVar25 = LocationUpdater::getNewStart
                               ((LocationUpdater *)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,BVar24);
            local_44 = uVar25;
          }
          else {
            if (uVar25 != 0x11) {
              if (uVar25 != 0x4109) {
                if (uVar25 == 0x2e) {
                  uVar25 = LocationUpdater::getNewFuncStart
                                     ((LocationUpdater *)
                                      &data.DebugLines.
                                       super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,BVar24);
                  local_44 = uVar25;
                  goto LAB_00cd364b;
                }
                if (uVar25 == 0x1d) goto LAB_00cd3622;
                Fatal::Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
                std::operator<<((ostream *)&newSections.super_StringMapImpl.NumBuckets,
                                "unknown tag with low_pc ");
                _auStack_a8 = llvm::dwarf::TagString(uVar25);
                llvm::StringRef::str_abi_cxx11_((string *)auStack_78,(StringRef *)auStack_a8);
                Fatal::operator<<((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)auStack_78);
                goto LAB_00cd3de4;
              }
              goto LAB_00cd3622;
            }
            uVar25 = LocationUpdater::getNewFuncStart
                               ((LocationUpdater *)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,BVar24);
            pmVar31 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&locationUpdater.debugLineMap._M_h._M_single_bucket,
                                   (key_type *)&local_c8);
            pmVar31->first = BVar24;
            pmVar31->second = uVar25;
            local_44 = uVar25;
          }
LAB_00cd364b:
          (pFVar46->Value).value = (ulong)uVar25;
LAB_00cd3685:
          pFVar46 = pFVar46 + 1;
          lVar38 = lVar38 + 0x10;
          goto LAB_00cd35c1;
        }
        goto LAB_00cd37bd;
      }
      pcVar36 = 
      "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<__gnu_cxx::__normal_iterator<llvm::DWARFDebugInfoEntry *, std::vector<llvm::DWARFDebugInfoEntry>>>, U = std::vector<llvm::DWARFYAML::Entry>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:902:9)]"
      ;
      goto LAB_00cd3bcb;
    }
    if (local_40 != pEVar9) {
      pcVar36 = 
      "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<__gnu_cxx::__normal_iterator<llvm::DWARFDebugInfoEntry *, std::vector<llvm::DWARFDebugInfoEntry>>>, U = std::vector<llvm::DWARFYAML::Entry>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:902:9)]"
      ;
      goto LAB_00cd3ce2;
    }
    local_100 = local_100 + 1;
    pUVar39 = pUVar39 + 1;
    uVar53.end_iterator = local_120;
    uVar53.begin_iterator = local_f8 + 1;
  }
  if (pUVar39 !=
      data.CompileUnits.
      super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pcVar36 = 
    "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit> *>, U = std::vector<llvm::DWARFYAML::Unit>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:889:5)]"
    ;
LAB_00cd3ce2:
    __assert_fail("yamlValue == yamlList.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                  ,0x314,pcVar36);
  }
  lVar38 = 8;
  this = &data.DebugLines.
          super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar40 = 0;
  pAVar35 = data.ARanges.
            super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  while( true ) {
    local_120 = uVar53.end_iterator;
    local_f8 = uVar53.begin_iterator;
    if ((ulong)(((long)data.Ranges.
                       super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)pAVar35) / 0x18) <= uVar40)
    break;
    BVar24 = *(BinaryLocation *)((long)pAVar35 + lVar38 + -8);
    uVar37 = *(uint *)((long)&(pAVar35->Length).TotalLength + lVar38);
    uVar50 = (ulong)uVar37;
    if ((2 < BVar24 + 2) && (2 < uVar37 + 2)) {
      BVar24 = LocationUpdater::getNewStart((LocationUpdater *)this,BVar24);
      BVar42 = LocationUpdater::getNewEnd((LocationUpdater *)this,uVar37);
      bVar23 = BVar24 + 2 < 3;
      bVar51 = BVar42 + 2 < 3;
      if (bVar51 || bVar23) {
        BVar24 = 0;
      }
      uVar50 = (ulong)BVar42;
      pAVar35 = data.ARanges.
                super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar51 || bVar23) {
        uVar50 = 1;
      }
    }
    uVar53.end_iterator = local_120;
    uVar53.begin_iterator = local_f8;
    *(ulong *)((long)pAVar35 + lVar38 + -8) = (ulong)BVar24;
    *(ulong *)((long)&(pAVar35->Length).TotalLength + lVar38) = uVar50;
    uVar40 = uVar40 + 1;
    lVar38 = lVar38 + 0x18;
  }
  bVar23 = true;
  lVar38 = 0x2c;
  uVar40 = 1;
  uVar43 = 0;
  do {
    local_120 = uVar53.end_iterator;
    local_f8 = uVar53.begin_iterator;
    if ((ulong)(((long)data.Locs.
                       super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                (long)data.Ranges.
                      super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) / 0x28) <= uVar43) {
      llvm::DWARFYAML::EmitDebugSections
                ((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                  *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,(Data *)local_658,false)
      ;
      pCVar13 = (local_f0->customSections).
                super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      this_00 = &((local_f0->customSections).
                  super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                  _M_impl.super__Vector_impl_data._M_start)->data;
      while( true ) {
        str = (pointer)((long)&this_00[-2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data + 0x10);
        if (str == pCVar13) break;
        IString::IString((IString *)auStack_78,(string *)str);
        bVar23 = IString::startsWith<8>((IString *)auStack_78,(char (*) [8])".debug_");
        if (bVar23) {
          std::__cxx11::string::substr((ulong)auStack_78,(ulong)str);
          Key.Data._4_4_ = auStack_78._4_4_;
          Key.Data._0_4_ = auStack_78._0_4_;
          Key.Length._0_4_ = llvmName._M_dataplus._M_p._0_4_;
          Key.Length._4_4_ = llvmName._M_dataplus._M_p._4_4_;
          sVar32 = llvm::
                   StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                   ::count((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                            *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,Key);
          if (sVar32 != 0) {
            Key_00.Data._4_4_ = auStack_78._4_4_;
            Key_00.Data._0_4_ = auStack_78._0_4_;
            Key_00.Length._0_4_ = llvmName._M_dataplus._M_p._0_4_;
            Key_00.Length._4_4_ = llvmName._M_dataplus._M_p._4_4_;
            puVar33 = llvm::
                      StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                      ::operator[]((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                                    *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,Key_00
                                  );
            pMVar14 = (puVar33->_M_t).
                      super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
                      .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
            pcVar36 = pMVar14->BufferStart;
            pcVar15 = pMVar14->BufferEnd;
            __new_size = (long)pcVar15 - (long)pcVar36;
            std::vector<char,_std::allocator<char>_>::resize(this_00,__new_size);
            if (pcVar15 != pcVar36) {
              memmove((this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start,pcVar36,__new_size);
            }
          }
          std::__cxx11::string::~string((string *)auStack_78);
        }
        this_00 = (vector<char,_std::allocator<char>_> *)
                  ((long)&this_00[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data + 8);
      }
      llvm::
      StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
      ::~StringMap((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                    *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
      LocationUpdater::~LocationUpdater
                ((LocationUpdater *)
                 &data.DebugLines.
                  super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      llvm::DWARFYAML::Data::~Data((Data *)local_658);
      BinaryenDWARFInfo::~BinaryenDWARFInfo((BinaryenDWARFInfo *)local_168);
      return;
    }
    puVar48 = (uint *)((long)data.Ranges.
                             super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar43 * 0x28);
    if (bVar23) {
      in_R9 = LocationUpdater::getCompileUnitBasesForLoc
                        ((LocationUpdater *)
                         &data.DebugLines.
                          super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         *(size_t *)(puVar48 + 8));
      uVar50 = (ulong)in_R9 >> 0x20;
    }
    uVar37 = *puVar48;
    uVar25 = puVar48[1];
    if (uVar37 == 0xffffffff) {
      uVar50 = 0xffffffff;
      uVar41 = uVar40;
      for (lVar47 = lVar38;
          ((uVar37 = (uint)uVar50,
           uVar41 < (ulong)(((long)data.Locs.
                                   super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>
                                   ._M_impl.super__Vector_impl_data._M_start -
                            (long)data.Ranges.
                                  super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage) / 0x28) &&
           (iVar45 = *(int *)((long)data.Ranges.
                                    super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar47 + -4
                             ), iVar45 != -1)) &&
          ((2 < iVar45 + 2U ||
           (2 < *(int *)((long)&(data.Ranges.
                                 super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->Start + lVar47
                        ) + 2U)))); lVar47 = lVar47 + 0x28) {
        BVar24 = LocationUpdater::getNewStart
                           ((LocationUpdater *)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar45 + uVar25);
        if (BVar24 < uVar37) {
          uVar37 = BVar24;
        }
        if (BVar24 != 0) {
          uVar50 = (ulong)uVar37;
        }
        uVar41 = uVar41 + 1;
      }
      if (uVar37 == 0xffffffff) {
        uVar50 = 0;
      }
      in_R9.second = 0;
      in_R9.first = uVar25;
      uVar37 = 0xffffffff;
      uVar25 = (uint)uVar50;
LAB_00cd3a4b:
      bVar23 = false;
    }
    else {
      bVar23 = true;
      if (2 < uVar37 + 2 || 2 < uVar25 + 2) {
        BVar24 = LocationUpdater::getNewStart
                           ((LocationUpdater *)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar37 + in_R9.first
                           );
        BVar42 = LocationUpdater::getNewEnd
                           ((LocationUpdater *)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            puVar48[1] + in_R9.first);
        if (BVar42 <= BVar24 - 1) {
          uVar37 = 1;
          uVar25 = uVar37;
          goto LAB_00cd3a4b;
        }
        uVar49 = (uint)uVar50;
        if ((BVar24 < uVar49) || (BVar42 < uVar49)) {
          __assert_fail("newStart >= newBase && newEnd >= newBase",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                        ,0x40d,
                        "void wasm::Debug::updateLoc(llvm::DWARFYAML::Data &, const LocationUpdater &)"
                       );
        }
        uVar25 = BVar42 - uVar49;
        uVar37 = BVar24 - uVar49;
        if (BVar42 - uVar49 == 0 && BVar24 - uVar49 == 0) {
          uVar25 = 1;
          uVar37 = 1;
        }
        bVar23 = false;
      }
    }
    uVar53.end_iterator = local_120;
    uVar53.begin_iterator = local_f8;
    *puVar48 = uVar37;
    puVar48[1] = uVar25;
    uVar43 = uVar43 + 1;
    lVar38 = lVar38 + 0x28;
    uVar40 = uVar40 + 1;
  } while( true );
LAB_00cd36db:
  if (pFVar46 != pFVar12) {
    pcVar36 = 
    "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:807:5)]"
    ;
    goto LAB_00cd3ce2;
  }
  uVar50 = *(ulong *)((long)info.context._M_t.
                            super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                            .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl + 8);
  uVar37 = *(uint *)((long)info.context._M_t.
                           super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                           .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl + 0x10);
  pFVar46 = (local_40->Values).
            super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (lVar38 = 0;
      pFVar12 = (local_40->Values).
                super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                ._M_impl.super__Vector_impl_data._M_finish, (ulong)uVar37 << 4 != lVar38;
      lVar38 = lVar38 + 0x10) {
    if (pFVar46 == pFVar12) {
      pcVar36 = 
      "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:849:5)]"
      ;
      goto LAB_00cd3bcb;
    }
    if (*(short *)(uVar50 + lVar38) == 0x12) {
      sVar3 = *(short *)(uVar50 + 2 + lVar38);
      BVar42 = BVar24;
      if (sVar3 != 6) {
        BVar42 = 0;
      }
      BVar42 = BVar42 + (int)(pFVar46->Value).value;
      if (uVar25 < 0x2f) {
        if ((0x20000c00UL >> ((ulong)TVar2 & 0x3f) & 1) != 0) goto LAB_00cd377c;
        if ((0x400000020000U >> ((ulong)TVar2 & 0x3f) & 1) == 0) goto LAB_00cd3771;
        BVar42 = LocationUpdater::getNewFuncEnd
                           ((LocationUpdater *)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,BVar42);
      }
      else {
LAB_00cd3771:
        if (uVar25 != 0x4109) {
          Fatal::Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
          std::operator<<((ostream *)&newSections.super_StringMapImpl.NumBuckets,
                          "unknown tag with low_pc ");
          _auStack_a8 = llvm::dwarf::TagString(uVar25);
          llvm::StringRef::str_abi_cxx11_((string *)auStack_78,(StringRef *)auStack_a8);
          Fatal::operator<<((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            auStack_78);
LAB_00cd3de4:
          std::__cxx11::string::~string((string *)auStack_78);
          Fatal::~Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
        }
LAB_00cd377c:
        BVar42 = LocationUpdater::getNewExprEnd
                           ((LocationUpdater *)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,BVar42);
      }
      BVar34 = local_44;
      if (sVar3 != 6) {
        BVar34 = 0;
      }
      (pFVar46->Value).value = (ulong)(BVar42 - BVar34);
    }
    pFVar46 = pFVar46 + 1;
  }
  if (pFVar46 != pFVar12) {
    pcVar36 = 
    "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:849:5)]"
    ;
    goto LAB_00cd3ce2;
  }
LAB_00cd37bd:
  local_40 = local_40 + 1;
  dVar54.end_iterator._M_current = local_130._M_current;
  dVar54.begin_iterator._M_current = _Var29._M_current + 1;
  goto LAB_00cd3550;
}

Assistant:

void writeDWARFSections(Module& wasm, const BinaryLocations& newLocations) {
  BinaryenDWARFInfo info(wasm);

  // Convert to Data representation, which YAML can use to write.
  llvm::DWARFYAML::Data data;
  if (dwarf2yaml(*info.context, data)) {
    Fatal() << "Failed to parse DWARF to YAML";
  }

  LocationUpdater locationUpdater(wasm, newLocations);

  updateDebugLines(data, locationUpdater);

  bool is64 = wasm.memories.size() > 0 ? wasm.memories[0]->is64() : false;
  updateCompileUnits(info, data, locationUpdater, is64);

  updateRanges(data, locationUpdater);

  updateLoc(data, locationUpdater);

  // Convert to binary sections.
  auto newSections =
    EmitDebugSections(data, false /* EmitFixups for debug_info */);

  // Update the custom sections in the wasm.
  // TODO: efficiency
  for (auto& section : wasm.customSections) {
    if (Name(section.name).startsWith(".debug_")) {
      auto llvmName = section.name.substr(1);
      if (newSections.count(llvmName)) {
        auto llvmData = newSections[llvmName]->getBuffer();
        section.data.resize(llvmData.size());
        std::copy(llvmData.begin(), llvmData.end(), section.data.data());
      }
    }
  }
}